

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  unsigned_long_long uVar1;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameSizeInfo ZStack_38;
  
  if (srcSize == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      ZSTD_findFrameSizeInfo(&ZStack_38,src,srcSize);
      if ((0xffffffffffffff88 < ZStack_38.compressedSize) ||
         (ZStack_38.decompressedBound == 0xfffffffffffffffe)) {
        return 0xfffffffffffffffe;
      }
      if (srcSize < ZStack_38.compressedSize) {
        __assert_fail("srcSize >= compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x337,"unsigned long long ZSTD_decompressBound(const void *, size_t)");
      }
      src = (void *)((long)src + ZStack_38.compressedSize);
      uVar1 = uVar1 + ZStack_38.decompressedBound;
      srcSize = srcSize - ZStack_38.compressedSize;
    } while (srcSize != 0);
  }
  return uVar1;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}